

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)

{
  DataType baseType;
  Message *pMVar1;
  int64_t val;
  int64_t local_30;
  data_view local_28;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return -0x8000000000000000;
    }
    data = &pMVar1->data;
  }
  local_28.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
  local_28.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
  helics::valueExtract<long>(&local_28,baseType,&local_30);
  if (local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return local_30;
}

Assistant:

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return helics::invalidValue<int64_t>();
    }
    int64_t val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return val;
}